

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_object.h
# Opt level: O3

void __thiscall
booster::shared_object::
symbol<cppcms::sessions::session_storage_factory*(*)(cppcms::json::value_const&)>
          (shared_object *this,_func_session_storage_factory_ptr_value_ptr **s,string *name)

{
  _func_session_storage_factory_ptr_value_ptr *p_Var1;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  p_Var1 = (_func_session_storage_factory_ptr_value_ptr *)
           booster::shared_object::resolve_symbol((string *)this);
  if (p_Var1 != (_func_session_storage_factory_ptr_value_ptr *)0x0) {
    *s = p_Var1;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
  std::operator+(&bStack_38,"booster::shared_object:failed to resolve symbol:",name);
  runtime_error::runtime_error(this_00,&bStack_38);
  __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

void symbol(T &s,std::string const &name) const
		{
			void *p = resolve_symbol(name);
			if(!p) {
				throw booster::runtime_error("booster::shared_object:failed to resolve symbol:" + name);
			}
			s = reinterpret_cast<T>(reinterpret_cast<size_t>(p));
		}